

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall sptk::Matrix::FillDiagonal(Matrix *this,double value)

{
  pointer __s;
  pointer pdVar1;
  pointer ppdVar2;
  uint uVar3;
  ulong uVar4;
  
  __s = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar1 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar1) {
    memset(__s,0,((long)pdVar1 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  uVar3 = this->num_row_;
  if (this->num_column_ < this->num_row_) {
    uVar3 = this->num_column_;
  }
  if (0 < (int)uVar3) {
    ppdVar2 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      ppdVar2[uVar4][uVar4] = value;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void Matrix::FillDiagonal(double value) {
  Fill(0.0);
  const int num_ones(std::min(num_row_, num_column_));
  for (int i(0); i < num_ones; ++i) {
    index_[i][i] = value;
  }
}